

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O3

void __thiscall
trackerboy::apu::Hardware::setMix(Hardware *this,ChannelMix *mix,Mixer *mixer,uint32_t cycletime)

{
  undefined8 uVar1;
  MixMode MVar2;
  float *pfVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  MixMode MVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar3 = (mixer->mBuffer)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
           super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  sVar4 = mixer->mWriteIndex;
  lVar5 = 0;
  do {
    MVar2 = mix->_M_elems[lVar5];
    MVar8 = (this->mMix)._M_elems[lVar5];
    if (MVar2 != MVar8) {
      MVar8 = MVar8 ^ MVar2;
      fVar10 = 7.5 - (float)(this->mLastOutputs)._M_elems[lVar5];
      fVar11 = 0.0;
      fVar9 = 0.0;
      if (((MVar8 & left) != mute) &&
         (fVar9 = mixer->mVolumeStepLeft * fVar10, (MVar2 & left) != mute)) {
        fVar9 = -fVar9;
      }
      if (((MVar8 & right) != mute) &&
         (fVar11 = fVar10 * mixer->mVolumeStepRight, (MVar2 & right) != mute)) {
        fVar11 = -fVar11;
      }
      fVar10 = mixer->mFactor * (float)cycletime + mixer->mSampleOffset;
      uVar7 = (ulong)fVar10;
      lVar6 = ((long)(fVar10 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7) + sVar4;
      uVar1 = *(undefined8 *)(pfVar3 + lVar6 * 2);
      *(ulong *)(pfVar3 + lVar6 * 2) =
           CONCAT44((float)((ulong)uVar1 >> 0x20) + fVar11,(float)uVar1 + fVar9);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  uVar1 = *(undefined8 *)(mix->_M_elems + 2);
  *(undefined8 *)(this->mMix)._M_elems = *(undefined8 *)mix->_M_elems;
  *(undefined8 *)((this->mMix)._M_elems + 2) = uVar1;
  return;
}

Assistant:

void Hardware::setMix(const ChannelMix &mix, Mixer &mixer, uint32_t cycletime) noexcept {

    // check for changes in the mix
    for (size_t i = 0; i < mMix.size(); ++i) {
        auto const next = mix[i];
        auto &last = mMix[i];

        if (next != last) {
            auto changes = +last ^ +next;

            float dcLeft = 0.0f;
            float dcRight = 0.0f;
            auto const level = 7.5f - mLastOutputs[i];
            if (changes & MIX_LEFT) {
                dcLeft = mixer.leftVolume() * level;
                if (modePansLeft(next)) {
                    dcLeft = -dcLeft;
                }
            }

            if (changes & MIX_RIGHT) {
                dcRight = mixer.rightVolume() * level;
                if (modePansRight(next)) {
                    dcRight = -dcRight;
                }
            }

            mixer.mixDc(dcLeft, dcRight, cycletime);
        }
    }


    mMix = mix;
}